

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O2

void __thiscall
trun::TestResponseProxy::QueryInterface(TestResponseProxy *this,uint32_t interface_id,void **outPtr)

{
  if (outPtr == (void **)0x0) {
    gnilk::Log::Error<char_const*>(this->pLogger,"QueryInterface, outPtr is null");
  }
  if (interface_id == 0xc07f19) {
    gnilk::Log::Debug<char_const*,unsigned_int>
              (this->pLogger,"QueryInterface, interface_id = %d, returning TRUN_IConfig",0xc07f19);
    *outPtr = &GetTRConfigInterface::trp_config_bridge;
    return;
  }
  *outPtr = (void *)0x0;
  gnilk::Log::Debug<char_const*,unsigned_int>
            (this->pLogger,"QueryInterface, invalid interface id (%d)",interface_id);
  return;
}

Assistant:

void TestResponseProxy::QueryInterface(uint32_t interface_id, void **outPtr) {
    if (outPtr == nullptr) {
        pLogger->Error("QueryInterface, outPtr is null");
    }

    switch(interface_id) {
        case ITestingConfig_IFace_ID :
            pLogger->Debug("QueryInterface, interface_id = %d, returning TRUN_IConfig", interface_id);
            *outPtr = (void *)GetTRConfigInterface();
            break;
        default :
            *outPtr = nullptr;
            pLogger->Debug("QueryInterface, invalid interface id (%d)", interface_id);
            break;
    }

}